

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::ShaderSource::exec(ShaderSource *this,Thread *t)

{
  code *pcVar1;
  deUint32 err;
  deBool dVar2;
  MessageBuilder *pMVar3;
  Shader *pSVar4;
  MessageBuilder local_358;
  MessageBuilder local_1b8;
  char *local_28;
  char *shaderSource;
  EGLThread *thread;
  Thread *t_local;
  ShaderSource *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  shaderSource = (char *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0)
  ;
  if (shaderSource == (char *)0x0) {
    __cxa_bad_cast();
  }
  local_28 = (char *)std::__cxx11::string::c_str();
  tcu::ThreadUtil::Thread::newMessage(&local_1b8,(Thread *)shaderSource);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b8,(char (*) [25])"Begin -- glShaderSource(");
  pSVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&pSVar4->shader);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(char (*) [7])", 1, \"");
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&local_28);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(char (*) [12])"\", DE_NULL)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b8);
  do {
    pcVar1 = *(code **)(*(long *)(shaderSource + 0x88) + 0x12b8);
    pSVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
    (*pcVar1)(pSVar4->shader,1,&local_28,0);
    err = (**(code **)(*(long *)(shaderSource + 0x88) + 0x800))();
    glu::checkError(err,"shaderSource(m_shader->shader, 1, &shaderSource, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x58f);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_358,(Thread *)shaderSource);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_358,(char (*) [24])"End -- glShaderSource()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_358);
  return;
}

Assistant:

void ShaderSource::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	const char* shaderSource = m_source.c_str();

	thread.newMessage() << "Begin -- glShaderSource(" << m_shader->shader << ", 1, \"" << shaderSource << "\", DE_NULL)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, shaderSource(m_shader->shader, 1, &shaderSource, DE_NULL));
	thread.newMessage() << "End -- glShaderSource()" << tcu::ThreadUtil::Message::End;
}